

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void __thiscall rcg::Image::Image(Image *this,Buffer *buffer,uint32_t part)

{
  bool bVar1;
  uint64_t uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  Buffer *this_00;
  pointer __dest;
  void *__src;
  undefined8 uVar5;
  long in_RDI;
  size_t size;
  uchar *in_stack_fffffffffffffea8;
  Buffer *in_stack_fffffffffffffeb0;
  Buffer *in_stack_fffffffffffffeb8;
  allocator *paVar6;
  undefined8 in_stack_fffffffffffffec0;
  uint32_t uVar7;
  Buffer *in_stack_fffffffffffffec8;
  Buffer *in_stack_fffffffffffffed0;
  Buffer *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  uint32_t part_00;
  Buffer *in_stack_fffffffffffffee8;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  allocator local_89;
  string local_88 [38];
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  size_t local_40;
  size_t local_38;
  ulong local_30;
  
  part_00 = (uint32_t)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  uVar7 = (uint32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffffeb0);
  bVar1 = Buffer::getImagePresent
                    (in_stack_fffffffffffffed8,(uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20))
  ;
  if (!bVar1) {
    uVar5 = __cxa_allocate_exception(0x28);
    paVar6 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Image::Image(): Now image available.",paVar6);
    GenTLException::GenTLException
              ((GenTLException *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  uVar2 = Buffer::getTimestampNS
                    ((Buffer *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  *(uint64_t *)(in_RDI + 8) = uVar2;
  sVar3 = Buffer::getWidth(in_stack_fffffffffffffee8,part_00);
  *(size_t *)(in_RDI + 0x10) = sVar3;
  sVar3 = Buffer::getHeight(in_stack_fffffffffffffee8,part_00);
  *(size_t *)(in_RDI + 0x18) = sVar3;
  sVar3 = Buffer::getXOffset(in_stack_fffffffffffffee8,part_00);
  *(size_t *)(in_RDI + 0x20) = sVar3;
  sVar3 = Buffer::getYOffset(in_stack_fffffffffffffee8,part_00);
  *(size_t *)(in_RDI + 0x28) = sVar3;
  sVar3 = Buffer::getXPadding(in_stack_fffffffffffffec8,uVar7);
  *(size_t *)(in_RDI + 0x30) = sVar3;
  sVar3 = Buffer::getYPadding(in_stack_fffffffffffffeb8);
  *(size_t *)(in_RDI + 0x38) = sVar3;
  uVar2 = Buffer::getFrameID(in_stack_fffffffffffffeb0);
  *(uint64_t *)(in_RDI + 0x40) = uVar2;
  uVar2 = Buffer::getPixelFormat(in_stack_fffffffffffffee8,part_00);
  *(uint64_t *)(in_RDI + 0x48) = uVar2;
  bVar1 = Buffer::isBigEndian(in_stack_fffffffffffffed0);
  *(bool *)(in_RDI + 0x50) = bVar1;
  local_38 = Buffer::getSize(in_stack_fffffffffffffed8,
                             (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_40 = Buffer::getSizeFilled(in_stack_fffffffffffffeb0);
  puVar4 = std::min<unsigned_long>(&local_38,&local_40);
  local_30 = *puVar4;
  sVar3 = Buffer::getSizeFilled(in_stack_fffffffffffffeb0);
  if (sVar3 == 0) {
    local_62 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    paVar6 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Image without data",paVar6);
    GenTLException::GenTLException
              ((GenTLException *)in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    local_62 = 0;
    __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  this_00 = (Buffer *)operator_new__(local_30);
  uVar7 = (uint32_t)((ulong)in_RDI >> 0x20);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::reset<unsigned_char*,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      in_stack_fffffffffffffeb0);
  __src = Buffer::getBase(this_00,uVar7);
  memcpy(__dest,__src,local_30);
  return;
}

Assistant:

Image::Image(const Buffer *buffer, uint32_t part)
{
  if (buffer->getImagePresent(part))
  {
    timestamp=buffer->getTimestampNS();

    width=buffer->getWidth(part);
    height=buffer->getHeight(part);
    xoffset=buffer->getXOffset(part);
    yoffset=buffer->getYOffset(part);
    xpadding=buffer->getXPadding(part);
    ypadding=buffer->getYPadding();
    frameid=buffer->getFrameID();
    pixelformat=buffer->getPixelFormat(part);
    bigendian=buffer->isBigEndian();

    const size_t size=std::min(buffer->getSize(part), buffer->getSizeFilled());

    if (buffer->getSizeFilled() == 0)
    {
      throw GenTLException("Image without data");
    }

    pixel.reset(new uint8_t [size]);

    memcpy(pixel.get(), reinterpret_cast<uint8_t *>(buffer->getBase(part)), size);
  }
  else
  {
    throw GenTLException("Image::Image(): Now image available.");
  }
}